

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
Chainstate::InitCoinsDB
          (Chainstate *this,size_t cache_size_bytes,bool in_memory,bool should_wipe,
          path leveldb_name)

{
  undefined8 __p;
  path *in_R8;
  long in_FS_OFFSET;
  undefined1 local_a0 [48];
  path local_70;
  size_t local_48;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == true) {
    std::filesystem::__cxx11::path::_M_concat();
  }
  std::filesystem::__cxx11::path::path
            ((path *)(local_a0 + 8),&(this->m_chainman->m_options).datadir.super_path);
  fs::operator/((path *)(local_a0 + 0x30),(path *)(local_a0 + 8),in_R8);
  local_3e = 1;
  local_3d = (this->m_chainman->m_options).coins_db.force_compact;
  local_48 = cache_size_bytes;
  local_40 = in_memory;
  local_3f = should_wipe;
  std::make_unique<CoinsViews,DBParams,CoinsViewOptions_const&>
            ((DBParams *)local_a0,(CoinsViewOptions *)(local_a0 + 0x30));
  __p = local_a0._0_8_;
  local_a0._0_8_ = (pointer)0x0;
  std::__uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>::reset
            ((__uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_> *)&this->m_coins_views,
             (pointer)__p);
  std::unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_>::~unique_ptr
            ((unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *)local_a0);
  std::filesystem::__cxx11::path::~path((path *)(local_a0 + 0x30));
  std::filesystem::__cxx11::path::~path((path *)(local_a0 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::InitCoinsDB(
    size_t cache_size_bytes,
    bool in_memory,
    bool should_wipe,
    fs::path leveldb_name)
{
    if (m_from_snapshot_blockhash) {
        leveldb_name += node::SNAPSHOT_CHAINSTATE_SUFFIX;
    }

    m_coins_views = std::make_unique<CoinsViews>(
        DBParams{
            .path = m_chainman.m_options.datadir / leveldb_name,
            .cache_bytes = cache_size_bytes,
            .memory_only = in_memory,
            .wipe_data = should_wipe,
            .obfuscate = true,
            .options = m_chainman.m_options.coins_db},
        m_chainman.m_options.coins_view);
}